

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

string * __thiscall pbrt::syntactic::ParamArray<float>::toString_abi_cxx11_(ParamArray<float> *this)

{
  ostream *poVar1;
  size_type sVar2;
  undefined8 *in_RSI;
  string *in_RDI;
  float fVar3;
  size_t i;
  stringstream ss;
  size_t in_stack_fffffffffffffde8;
  ParamArray<float> *this_00;
  ulong local_1d0;
  string local_1b8 [32];
  stringstream local_198 [16];
  ParamArray<float> local_188 [4];
  
  std::__cxx11::stringstream::stringstream(local_198);
  (**(code **)*in_RSI)(local_1b8);
  poVar1 = std::operator<<((ostream *)local_188,local_1b8);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(local_1b8);
  std::operator<<((ostream *)local_188,"[ ");
  local_1d0 = 0;
  while( true ) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RSI + 3));
    if (sVar2 <= local_1d0) break;
    this_00 = local_188;
    fVar3 = get(this_00,in_stack_fffffffffffffde8);
    poVar1 = (ostream *)std::ostream::operator<<(this_00,fVar3);
    std::operator<<(poVar1," ");
    local_1d0 = local_1d0 + 1;
  }
  std::operator<<((ostream *)local_188,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string ParamArray<float>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      for (size_t i=0;i<this->size();i++)
        ss << get(i) << " ";
      ss << "]";
      return ss.str();
    }